

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_1::BufferView::Resources::Resources
          (Resources *this,Environment *env,Parameters *params)

{
  undefined8 uVar1;
  VkResult result;
  int iVar2;
  Move<vk::Handle<(vk::HandleType)7>_> local_70;
  VkBufferCreateInfo local_50;
  
  local_50.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_50.pNext = (void *)0x0;
  local_50._16_8_ = local_50._16_8_ & 0xffffffff00000000;
  local_50.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_50.queueFamilyIndexCount = 1;
  local_50.pQueueFamilyIndices = &env->queueFamilyIndex;
  local_50.size = (VkDeviceSize)params;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_70,env->vkd,env->device,
                     &local_50,env->allocationCallbacks);
  (this->buffer).object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)
       CONCAT44(local_70.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device._4_4_
                ,local_70.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device.
                 _0_4_);
  (this->buffer).object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(local_70.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator.
                _4_4_,local_70.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                      m_allocator._0_4_);
  (this->buffer).object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       CONCAT44(local_70.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal.
                _4_4_,(undefined4)
                      local_70.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                      m_internal);
  (this->buffer).object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       CONCAT44(local_70.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface.
                _4_4_,local_70.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                      m_deviceIface._0_4_);
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&local_50,env->vkd,env->device,
             (VkBuffer)
             (this->buffer).object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal);
  uVar1._4_4_ = local_50._4_4_;
  uVar1._0_4_ = local_50.sType;
  if (local_50.flags == 0) {
    iVar2 = 0x20;
  }
  else {
    iVar2 = 0;
    if (local_50.flags != 0) {
      for (; (local_50.flags >> iVar2 & 1) == 0; iVar2 = iVar2 + 1) {
      }
    }
  }
  local_50.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  local_50.pNext = (void *)0x0;
  local_50.size = CONCAT44(local_50.size._4_4_,iVar2);
  local_50._16_8_ = uVar1;
  ::vk::allocateMemory
            (&local_70,env->vkd,env->device,(VkMemoryAllocateInfo *)&local_50,
             env->allocationCallbacks);
  *(undefined4 *)
   &(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       local_70.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device._0_4_;
  *(undefined4 *)
   ((long)&(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
           m_device + 4) =
       local_70.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device._4_4_;
  *(undefined4 *)
   &(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       local_70.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator._0_4_;
  *(undefined4 *)
   ((long)&(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
           m_allocator + 4) =
       local_70.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator._4_4_;
  *(undefined4 *)
   &(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
       (undefined4)local_70.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  *(undefined4 *)
   ((long)&(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
           m_internal + 4) =
       local_70.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._4_4_;
  *(undefined4 *)
   &(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface
       = local_70.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface._0_4_;
  *(undefined4 *)
   ((long)&(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
           m_deviceIface + 4) =
       local_70.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface._4_4_;
  result = (*env->vkd->_vptr_DeviceInterface[0xc])
                     (env->vkd,env->device,
                      (this->buffer).object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                      object.m_internal,
                      (this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.
                      object.m_internal,0);
  ::vk::checkResult(result,"env.vkd.bindBufferMemory(env.device, *buffer.object, *memory.object, 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiObjectManagementTests.cpp"
                    ,0x2c7);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters& params)
			: buffer(env, params.buffer)
			, memory(env, getDeviceMemoryParameters(env, *buffer.object))
		{
			VK_CHECK(env.vkd.bindBufferMemory(env.device, *buffer.object, *memory.object, 0));
		}